

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::anon_unknown_5::MaximumMatcher::FindArgumentPathDFS
          (MaximumMatcher *this,int v,vector<bool,_std::allocator<bool>_> *visited)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  bool local_65;
  reference local_58;
  int local_48;
  int local_44;
  int matched_1;
  int i_1;
  int matched;
  int i;
  vector<bool,_std::allocator<bool>_> *local_28;
  vector<bool,_std::allocator<bool>_> *visited_local;
  MaximumMatcher *pMStack_18;
  int v_local;
  MaximumMatcher *this_local;
  
  local_28 = visited;
  visited_local._4_4_ = v;
  pMStack_18 = this;
  _matched = std::vector<bool,_std::allocator<bool>_>::operator[](visited,(long)v);
  std::_Bit_reference::operator=((_Bit_reference *)&matched,true);
  for (i_1 = 0; i_1 < this->count2_; i_1 = i_1 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this->match_list2_,(long)i_1);
    matched_1 = *pvVar3;
    if ((matched_1 == -1) &&
       (bVar2 = Match(this,visited_local._4_4_,i_1), vVar1 = visited_local._4_4_, bVar2)) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this->match_list2_,(long)i_1);
      *pvVar3 = vVar1;
      return true;
    }
  }
  local_44 = 0;
  do {
    if (this->count2_ <= local_44) {
      return false;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this->match_list2_,(long)local_44);
    local_48 = *pvVar3;
    if ((local_48 != -1) && (bVar2 = Match(this,visited_local._4_4_,local_44), bVar2)) {
      local_58 = std::vector<bool,_std::allocator<bool>_>::operator[](local_28,(long)local_48);
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_58);
      local_65 = false;
      if (!bVar2) {
        local_65 = FindArgumentPathDFS(this,local_48,local_28);
      }
      vVar1 = visited_local._4_4_;
      if (local_65 != false) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           (this->match_list2_,(long)local_44);
        *pvVar3 = vVar1;
        return true;
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

bool MaximumMatcher::FindArgumentPathDFS(int v, std::vector<bool>* visited) {
  (*visited)[v] = true;
  // We try to match those un-matched nodes on the right side first. This is
  // the step that the naive greedy matching algorithm uses. In the best cases
  // where the greedy algorithm can find a maximum matching, we will always
  // find a match in this step and the performance will be identical to the
  // greedy algorithm.
  for (int i = 0; i < count2_; ++i) {
    int matched = (*match_list2_)[i];
    if (matched == -1 && Match(v, i)) {
      (*match_list2_)[i] = v;
      return true;
    }
  }
  // Then we try those already matched nodes and see if we can find an
  // alternative match for the node matched to them.
  // The greedy algorithm will stop before this and fail to produce the
  // correct result.
  for (int i = 0; i < count2_; ++i) {
    int matched = (*match_list2_)[i];
    if (matched != -1 && Match(v, i)) {
      if (!(*visited)[matched] && FindArgumentPathDFS(matched, visited)) {
        (*match_list2_)[i] = v;
        return true;
      }
    }
  }
  return false;
}